

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void warnfcont(void *ud,char *message,int tocont)

{
  code *f;
  
  fputs(message,_stderr);
  fflush(_stderr);
  if (tocont == 0) {
    fputs("\n",_stderr);
    fflush(_stderr);
    f = warnfon;
  }
  else {
    f = warnfcont;
  }
  lua_setwarnf((lua_State *)ud,f,ud);
  return;
}

Assistant:

static void warnfcont (void *ud, const char *message, int tocont) {
  lua_State *L = (lua_State *)ud;
  lua_writestringerror("%s", message);  /* write message */
  if (tocont)  /* not the last part? */
    lua_setwarnf(L, warnfcont, L);  /* to be continued */
  else {  /* last part */
    lua_writestringerror("%s", "\n");  /* finish message with end-of-line */
    lua_setwarnf(L, warnfon, L);  /* next call is a new message */
  }
}